

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UnicodeString *left,UnicodeString *right,int32_t length,
          UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t *left_00;
  char16_t *right_00;
  undefined4 local_40;
  undefined4 local_3c;
  int32_t rightLength;
  int32_t leftLength;
  UErrorCode *errorCode_local;
  int32_t length_local;
  UnicodeString *right_local;
  UnicodeString *left_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if ((UVar1 == '\0') && (length != 0)) {
    if (length < 0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = UCOL_EQUAL;
    }
    else {
      local_3c = UnicodeString::length(left);
      local_40 = UnicodeString::length(right);
      if (length < local_3c) {
        local_3c = length;
      }
      if (length < local_40) {
        local_40 = length;
      }
      left_00 = UnicodeString::getBuffer(left);
      right_00 = UnicodeString::getBuffer(right);
      this_local._4_4_ = doCompare(this,left_00,local_3c,right_00,local_40,errorCode);
    }
  }
  else {
    this_local._4_4_ = UCOL_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult
RuleBasedCollator::compare(const UnicodeString &left, const UnicodeString &right,
                           int32_t length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode) || length == 0) { return UCOL_EQUAL; }
    if(length < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    int32_t leftLength = left.length();
    int32_t rightLength = right.length();
    if(leftLength > length) { leftLength = length; }
    if(rightLength > length) { rightLength = length; }
    return doCompare(left.getBuffer(), leftLength,
                     right.getBuffer(), rightLength, errorCode);
}